

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_router_interface.c
# Opt level: O0

void dlep_router_terminate_all_sessions(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  avl_tree *paVar3;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  dlep_router_session *router_session;
  dlep_router_if *interf;
  
  _shutting_down = true;
  paVar3 = dlep_if_get_tree(false);
  plVar1 = (paVar3->list_head).next;
  while( true ) {
    plVar2 = plVar1->prev;
    paVar3 = dlep_if_get_tree(false);
    if (plVar2 == (paVar3->list_head).prev) break;
    plVar2 = plVar1[3].prev;
    while( true ) {
      if (plVar2->prev == plVar1[4].next) break;
      dlep_session_terminate
                ((dlep_session *)&plVar2[-0x38].prev,DLEP_STATUS_OKAY,"DLEP router is shutting down"
                );
      plVar2 = plVar2->next;
    }
    plVar1 = plVar1->next;
  }
  return;
}

Assistant:

void
dlep_router_terminate_all_sessions(void) {
  struct dlep_router_if *interf;
  struct dlep_router_session *router_session;

  _shutting_down = true;

  avl_for_each_element(dlep_if_get_tree(false), interf, interf._node) {
    avl_for_each_element(&interf->interf.session_tree, router_session, _node) {
      dlep_session_terminate(&router_session->session, DLEP_STATUS_OKAY, "DLEP router is shutting down");
    }
  }
}